

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4_resetStreamStateHC(void *state,char *inputBuffer)

{
  LZ4_streamHC_t *LZ4_streamHCPtr;
  bool bVar1;
  
  bVar1 = ((ulong)state & 7) != 0;
  if (!bVar1 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
    *(undefined4 *)((long)state + 0x40020) = 0x10000;
    *(char **)((long)state + 0x40008) = inputBuffer + -0x10000;
    *(char **)((long)state + 0x40000) = inputBuffer;
    *(char **)((long)state + 0x40010) = inputBuffer + -0x10000;
    *(undefined8 *)((long)state + 0x40018) = 0x1000000010000;
  }
  return (uint)(bVar1 || state == (void *)0x0);
}

Assistant:

int LZ4_resetStreamStateHC(void* state, char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_initStreamHC(state, sizeof(*hc4));
    if (hc4 == NULL) return 1;   /* init failed */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return 0;
}